

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

int archiverInUse(PHYSFS_Archiver *arc,DirHandle *list)

{
  while( true ) {
    if (list == (DirHandle *)0x0) {
      return 0;
    }
    if (list->funcs == arc) break;
    list = list->next;
  }
  return 1;
}

Assistant:

static int archiverInUse(const PHYSFS_Archiver *arc, const DirHandle *list)
{
    const DirHandle *i;
    for (i = list; i != NULL; i = i->next)
    {
        if (i->funcs == arc)
            return 1;
    } /* for */

    return 0;  /* not in use */
}